

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_io.cc
# Opt level: O0

void core::image::save_mvei_file(ConstPtr *image,string *filename)

{
  string *psVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  invalid_argument *this;
  element_type *peVar5;
  undefined4 extraout_var;
  char *pcVar6;
  FileException *pFVar7;
  int *piVar8;
  char local_248 [8];
  ofstream out;
  size_t size;
  char *data;
  int local_30;
  int32_t type;
  int32_t channels;
  int32_t height;
  int32_t width;
  string *local_18;
  string *filename_local;
  ConstPtr *image_local;
  
  local_18 = filename;
  filename_local = (string *)image;
  bVar2 = std::operator==(image,(nullptr_t)0x0);
  if (bVar2) {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"Null image given");
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  peVar5 = std::__shared_ptr_access<const_core::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_core::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)image);
  channels = ImageBase::width(peVar5);
  peVar5 = std::__shared_ptr_access<const_core::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_core::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)image);
  type = ImageBase::height(peVar5);
  peVar5 = std::__shared_ptr_access<const_core::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_core::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)image);
  local_30 = ImageBase::channels(peVar5);
  peVar5 = std::__shared_ptr_access<const_core::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_core::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)image);
  data._4_4_ = (*peVar5->_vptr_ImageBase[6])();
  peVar5 = std::__shared_ptr_access<const_core::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_core::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)image);
  iVar4 = (*peVar5->_vptr_ImageBase[4])();
  peVar5 = std::__shared_ptr_access<const_core::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_core::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)image);
  (*peVar5->_vptr_ImageBase[3])();
  pcVar6 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_248,pcVar6,_S_bin);
  bVar3 = std::ios::good();
  if ((bVar3 & 1) == 0) {
    pFVar7 = (FileException *)__cxa_allocate_exception(0x48);
    psVar1 = local_18;
    piVar8 = __errno_location();
    pcVar6 = strerror(*piVar8);
    util::FileException::FileException(pFVar7,psVar1,pcVar6);
    __cxa_throw(pFVar7,&util::FileException::typeinfo,util::FileException::~FileException);
  }
  std::ostream::write(local_248,0x199eda);
  std::ostream::write(local_248,(long)&channels);
  std::ostream::write(local_248,(long)&type);
  std::ostream::write(local_248,(long)&local_30);
  std::ostream::write(local_248,(long)&data + 4);
  std::ostream::write(local_248,CONCAT44(extraout_var,iVar4));
  bVar3 = std::ios::good();
  if ((bVar3 & 1) == 0) {
    pFVar7 = (FileException *)__cxa_allocate_exception(0x48);
    psVar1 = local_18;
    piVar8 = __errno_location();
    pcVar6 = strerror(*piVar8);
    util::FileException::FileException(pFVar7,psVar1,pcVar6);
    __cxa_throw(pFVar7,&util::FileException::typeinfo,util::FileException::~FileException);
  }
  std::ofstream::~ofstream(local_248);
  return;
}

Assistant:

void
save_mvei_file (ImageBase::ConstPtr image, std::string const& filename)
{
    if (image == nullptr)
        throw std::invalid_argument("Null image given");

    int32_t width = image->width();
    int32_t height = image->height();
    int32_t channels = image->channels();
    int32_t type = image->get_type();
    char const* data = image->get_byte_pointer();
    std::size_t size = image->get_byte_size();

    std::ofstream out(filename.c_str(), std::ios::binary);
    if (!out.good())
        throw util::FileException(filename, std::strerror(errno));

    out.write(MVEI_FILE_SIGNATURE, MVEI_FILE_SIGNATURE_LEN);
    out.write(reinterpret_cast<char const*>(&width), sizeof(int32_t));
    out.write(reinterpret_cast<char const*>(&height), sizeof(int32_t));
    out.write(reinterpret_cast<char const*>(&channels), sizeof(int32_t));
    out.write(reinterpret_cast<char const*>(&type), sizeof(int32_t));
    out.write(data, size);

    if (!out.good())
        throw util::FileException(filename, std::strerror(errno));
}